

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CreateFunc(sqlite3 *db,char *zFunctionName,int nArg,int enc,void *pUserData,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,_func_void_sqlite3_context_ptr *xValue,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xInverse,
                     FuncDestructor *pDestructor)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint nArg_00;
  FuncDef *pFVar4;
  uint in_ECX;
  int in_EDX;
  sqlite3 *in_RSI;
  sqlite3 *in_RDI;
  void *in_R8;
  FuncDef *in_R9;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *unaff_retaddr;
  FuncDef *in_stack_00000008;
  sqlite3 *in_stack_00000010;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *in_stack_00000018;
  FuncDestructor *in_stack_00000020;
  FuncDestructor *in_stack_00000028;
  int rc;
  int extraFlags;
  FuncDef *p;
  FuncDef *in_stack_ffffffffffffff78;
  sqlite3 *in_stack_ffffffffffffff80;
  FuncDef *local_60;
  u8 in_stack_ffffffffffffffaa;
  u8 in_stack_ffffffffffffffab;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 uVar5;
  undefined1 uVar6;
  sqlite3 *psVar7;
  i16 iVar8;
  int local_14;
  
  psVar7 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  if (((in_RSI == (sqlite3 *)0x0) ||
      ((((in_R9 != (FuncDef *)0x0 && (in_stack_00000010 != (sqlite3 *)0x0)) ||
        ((in_stack_00000010 == (sqlite3 *)0x0) != (in_stack_00000008 == (FuncDef *)0x0))) ||
       (((in_stack_00000018 == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) !=
         (in_stack_00000020 == (FuncDestructor *)0x0) || (in_EDX < -1)))))) ||
     ((1000 < in_EDX || (iVar2 = sqlite3Strlen30((char *)in_stack_ffffffffffffff78), 0xff < iVar2)))
     ) {
    local_14 = sqlite3MisuseError(0);
  }
  else {
    uVar3 = in_ECX & 0x3380800;
    uVar5 = (undefined2)uVar3;
    uVar6 = (undefined1)(uVar3 >> 0x18);
    nArg_00 = in_ECX & 7;
    bVar1 = (byte)(uVar3 >> 0x10) ^ 0x20;
    local_60 = in_R9;
    uVar3 = nArg_00;
    if (2 < nArg_00 - 1) {
      if (nArg_00 == 4) {
        uVar3 = 2;
      }
      else if (nArg_00 == 5) {
        in_stack_ffffffffffffff78 = in_stack_00000008;
        in_stack_ffffffffffffff80 = in_stack_00000010;
        iVar2 = sqlite3CreateFunc(in_RSI,(char *)(CONCAT44(in_EDX,in_ECX) & 0xffffffff00000007),
                                  (int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9,
                                  (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)psVar7
                                  ,unaff_retaddr,(_func_void_sqlite3_context_ptr *)in_stack_00000008
                                  ,(_func_void_sqlite3_context_ptr *)in_stack_00000010,
                                  in_stack_00000018,in_stack_00000020);
        if (iVar2 == 0) {
          in_stack_ffffffffffffff78 = in_stack_00000008;
          in_stack_ffffffffffffff80 = in_stack_00000010;
          iVar2 = sqlite3CreateFunc(in_RSI,(char *)CONCAT44(in_EDX,uVar3),
                                    (int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9,
                                    (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                    psVar7,unaff_retaddr,
                                    (_func_void_sqlite3_context_ptr *)in_stack_00000008,
                                    (_func_void_sqlite3_context_ptr *)in_stack_00000010,
                                    in_stack_00000018,in_stack_00000020);
        }
        if (iVar2 != 0) {
          return iVar2;
        }
        in_stack_ffffffffffffffb0 = 0;
        local_60 = in_R9;
        uVar3 = 3;
      }
      else {
        uVar3 = 1;
      }
    }
    psVar7 = (sqlite3 *)
             sqlite3FindFunction(psVar7,(char *)CONCAT17(uVar6,CONCAT16(bVar1,CONCAT24(uVar5,
                                                  in_stack_ffffffffffffffb0))),nArg_00,
                                 in_stack_ffffffffffffffab,in_stack_ffffffffffffffaa);
    if (((psVar7 == (sqlite3 *)0x0) || ((*(u32 *)((long)&psVar7->pVfs + 4) & 3) != uVar3)) ||
       (*(short *)&psVar7->pVfs != in_EDX)) {
      if ((local_60 == (FuncDef *)0x0) && (in_stack_00000010 == (sqlite3 *)0x0)) {
        return 0;
      }
    }
    else {
      if (in_RDI->nVdbeActive != 0) {
        sqlite3ErrorWithMsg(in_RDI,5,
                            "unable to delete/modify user-function due to active statements");
        return 5;
      }
      sqlite3ExpirePreparedStatements(in_RDI,0);
    }
    iVar8 = (i16)in_EDX;
    pFVar4 = sqlite3FindFunction(psVar7,(char *)CONCAT17(uVar6,CONCAT16(bVar1,CONCAT24(uVar5,
                                                  in_stack_ffffffffffffffb0))),nArg_00,
                                 in_stack_ffffffffffffffab,in_stack_ffffffffffffffaa);
    if (pFVar4 == (FuncDef *)0x0) {
      local_14 = 7;
    }
    else {
      functionDestroy(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (in_stack_00000028 != (FuncDestructor *)0x0) {
        in_stack_00000028->nRef = in_stack_00000028->nRef + 1;
      }
      (pFVar4->u).pDestructor = in_stack_00000028;
      pFVar4->funcFlags = pFVar4->funcFlags & 3 | CONCAT13(uVar6,CONCAT12(bVar1,uVar5));
      if (local_60 == (FuncDef *)0x0) {
        local_60 = in_stack_00000008;
      }
      pFVar4->xSFunc = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)local_60;
      pFVar4->xFinalize = (_func_void_sqlite3_context_ptr *)in_stack_00000010;
      pFVar4->xValue = (_func_void_sqlite3_context_ptr *)in_stack_00000018;
      pFVar4->xInverse =
           (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)in_stack_00000020;
      pFVar4->pUserData = in_R8;
      pFVar4->nArg = iVar8;
      local_14 = 0;
    }
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3CreateFunc(
  sqlite3 *db,
  const char *zFunctionName,
  int nArg,
  int enc,
  void *pUserData,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value **),
  void (*xStep)(sqlite3_context*,int,sqlite3_value **),
  void (*xFinal)(sqlite3_context*),
  void (*xValue)(sqlite3_context*),
  void (*xInverse)(sqlite3_context*,int,sqlite3_value **),
  FuncDestructor *pDestructor
){
  FuncDef *p;
  int extraFlags;

  assert( sqlite3_mutex_held(db->mutex) );
  assert( xValue==0 || xSFunc==0 );
  if( zFunctionName==0                /* Must have a valid name */
   || (xSFunc!=0 && xFinal!=0)        /* Not both xSFunc and xFinal */
   || ((xFinal==0)!=(xStep==0))       /* Both or neither of xFinal and xStep */
   || ((xValue==0)!=(xInverse==0))    /* Both or neither of xValue, xInverse */
   || (nArg<-1 || nArg>SQLITE_MAX_FUNCTION_ARG)
   || (255<sqlite3Strlen30(zFunctionName))
  ){
    return SQLITE_MISUSE_BKPT;
  }

  assert( SQLITE_FUNC_CONSTANT==SQLITE_DETERMINISTIC );
  assert( SQLITE_FUNC_DIRECT==SQLITE_DIRECTONLY );
  extraFlags = enc &  (SQLITE_DETERMINISTIC|SQLITE_DIRECTONLY|
                       SQLITE_SUBTYPE|SQLITE_INNOCUOUS|
                       SQLITE_RESULT_SUBTYPE|SQLITE_SELFORDER1);
  enc &= (SQLITE_FUNC_ENCMASK|SQLITE_ANY);

  /* The SQLITE_INNOCUOUS flag is the same bit as SQLITE_FUNC_UNSAFE.  But
  ** the meaning is inverted.  So flip the bit. */
  assert( SQLITE_FUNC_UNSAFE==SQLITE_INNOCUOUS );
  extraFlags ^= SQLITE_FUNC_UNSAFE;  /* tag-20230109-1 */


#ifndef SQLITE_OMIT_UTF16
  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  **
  ** If SQLITE_ANY is specified, add three versions of the function
  ** to the hash table.
  */
  switch( enc ){
    case SQLITE_UTF16:
      enc = SQLITE_UTF16NATIVE;
      break;
    case SQLITE_ANY: {
      int rc;
      rc = sqlite3CreateFunc(db, zFunctionName, nArg,
           (SQLITE_UTF8|extraFlags)^SQLITE_FUNC_UNSAFE, /* tag-20230109-1 */
           pUserData, xSFunc, xStep, xFinal, xValue, xInverse, pDestructor);
      if( rc==SQLITE_OK ){
        rc = sqlite3CreateFunc(db, zFunctionName, nArg,
             (SQLITE_UTF16LE|extraFlags)^SQLITE_FUNC_UNSAFE, /* tag-20230109-1*/
             pUserData, xSFunc, xStep, xFinal, xValue, xInverse, pDestructor);
      }
      if( rc!=SQLITE_OK ){
        return rc;
      }
      enc = SQLITE_UTF16BE;
      break;
    }
    case SQLITE_UTF8:
    case SQLITE_UTF16LE:
    case SQLITE_UTF16BE:
      break;
    default:
      enc = SQLITE_UTF8;
      break;
  }
#else
  enc = SQLITE_UTF8;
#endif

  /* Check if an existing function is being overridden or deleted. If so,
  ** and there are active VMs, then return SQLITE_BUSY. If a function
  ** is being overridden/deleted but there are no active VMs, allow the
  ** operation to continue but invalidate all precompiled statements.
  */
  p = sqlite3FindFunction(db, zFunctionName, nArg, (u8)enc, 0);
  if( p && (p->funcFlags & SQLITE_FUNC_ENCMASK)==(u32)enc && p->nArg==nArg ){
    if( db->nVdbeActive ){
      sqlite3ErrorWithMsg(db, SQLITE_BUSY,
        "unable to delete/modify user-function due to active statements");
      assert( !db->mallocFailed );
      return SQLITE_BUSY;
    }else{
      sqlite3ExpirePreparedStatements(db, 0);
    }
  }else if( xSFunc==0 && xFinal==0 ){
    /* Trying to delete a function that does not exist.  This is a no-op.
    ** https://sqlite.org/forum/forumpost/726219164b */
    return SQLITE_OK;
  }

  p = sqlite3FindFunction(db, zFunctionName, nArg, (u8)enc, 1);
  assert(p || db->mallocFailed);
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }

  /* If an older version of the function with a configured destructor is
  ** being replaced invoke the destructor function here. */
  functionDestroy(db, p);

  if( pDestructor ){
    pDestructor->nRef++;
  }
  p->u.pDestructor = pDestructor;
  p->funcFlags = (p->funcFlags & SQLITE_FUNC_ENCMASK) | extraFlags;
  testcase( p->funcFlags & SQLITE_DETERMINISTIC );
  testcase( p->funcFlags & SQLITE_DIRECTONLY );
  p->xSFunc = xSFunc ? xSFunc : xStep;
  p->xFinalize = xFinal;
  p->xValue = xValue;
  p->xInverse = xInverse;
  p->pUserData = pUserData;
  p->nArg = (u16)nArg;
  return SQLITE_OK;
}